

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>
::find_position<std::__cxx11::string>
          (sparse_hashtable<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  const_reference b;
  ulong uVar4;
  ulong i;
  long lVar5;
  ulong uVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  
  lVar1 = *(long *)(this + 0x80);
  sVar3 = Hasher::operator()((Hasher *)this,key);
  uVar6 = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    i = sVar3 & lVar1 - 1U;
    bVar2 = sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::test((sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)(this + 0x68),i);
    if (!bVar2) {
      uVar4 = i;
      if (uVar6 != 0xffffffffffffffff) {
        uVar4 = uVar6;
      }
      i = 0xffffffffffffffff;
LAB_00999e15:
      pVar7.second = uVar4;
      pVar7.first = i;
      return pVar7;
    }
    bVar2 = sparse_hashtable<$6111fa4$>::test_deleted((sparse_hashtable<_6111fa4_> *)this,i);
    if (bVar2) {
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = i;
      }
    }
    else {
      b = sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::unsafe_get((sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        *)(this + 0x68),i);
      bVar2 = Hasher::operator()((Hasher *)(this + 0x30),key,&b->first);
      if (bVar2) {
        uVar4 = 0xffffffffffffffff;
        goto LAB_00999e15;
      }
    }
    sVar3 = i + lVar5 + 1;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }